

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O3

int __thiscall cmCPackDebGenerator::createDbgsymDDeb(cmCPackDebGenerator *this)

{
  size_type *psVar1;
  bool bVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  long *plVar5;
  char *pcVar6;
  size_type *psVar7;
  cmCPackLog *pcVar8;
  string local_418;
  allocator<char> local_3f4;
  allocator<char> local_3f3;
  allocator<char> local_3f2;
  allocator<char> local_3f1;
  key_type local_3f0;
  key_type local_3d0;
  string local_3b0;
  string local_390;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  controlValues;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string packageNameLower;
  DebGenerator gen;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &controlValues._M_t._M_impl.super__Rb_tree_header._M_header;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_418,"GEN_CPACK_DEBIAN_PACKAGE_NAME","");
  pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_418);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,pcVar3,(allocator<char> *)&local_3f0);
  cmsys::SystemTools::LowerCase(&packageNameLower,(string *)&gen);
  psVar1 = &gen.OutputName._M_string_length;
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_VERSION","");
  pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&gen,packageNameLower._M_dataplus._M_p,
             packageNameLower._M_dataplus._M_p + packageNameLower._M_string_length);
  std::__cxx11::string::append((char *)&gen);
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"Package","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&local_418);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&gen);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Package-Type","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x4d2ffb);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Version","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  pcVar6 = (char *)pmVar4->_M_string_length;
  strlen(pcVar3);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,pcVar6,(ulong)pcVar3);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Auto-Built-Package","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x4d300d);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_390,"GEN_CPACK_DEBIAN_PACKAGE_NAME","");
  pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_390);
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0," (= ","");
  strlen(pcVar3);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_3b0,0,(char *)0x0,(ulong)pcVar3);
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_3f0.field_2._M_allocated_capacity = *psVar7;
    local_3f0.field_2._8_8_ = plVar5[3];
  }
  else {
    local_3f0.field_2._M_allocated_capacity = *psVar7;
    local_3f0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_3f0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_3f0);
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_418.field_2._M_allocated_capacity = *psVar7;
    local_418.field_2._8_8_ = plVar5[3];
  }
  else {
    local_418.field_2._M_allocated_capacity = *psVar7;
    local_418._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_418._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_418);
  pcVar8 = (cmCPackLog *)(plVar5 + 2);
  if ((cmCPackLog *)*plVar5 == pcVar8) {
    gen.OutputName._M_string_length._0_1_ = pcVar8->Verbose;
    gen.OutputName._M_string_length._1_1_ = pcVar8->Debug;
    gen.OutputName._M_string_length._2_1_ = pcVar8->Quiet;
    gen.OutputName._M_string_length._3_1_ = pcVar8->NewLine;
    gen.OutputName._M_string_length._4_4_ = pcVar8->LastTag;
    gen.OutputName.field_2._M_allocated_capacity._0_4_ = (undefined4)plVar5[3];
    gen.OutputName.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    gen.Logger = (cmCPackLog *)psVar1;
  }
  else {
    gen.OutputName._M_string_length._0_1_ = pcVar8->Verbose;
    gen.OutputName._M_string_length._1_1_ = pcVar8->Debug;
    gen.OutputName._M_string_length._2_1_ = pcVar8->Quiet;
    gen.OutputName._M_string_length._3_1_ = pcVar8->NewLine;
    gen.OutputName._M_string_length._4_4_ = pcVar8->LastTag;
    gen.Logger = (cmCPackLog *)*plVar5;
  }
  gen.OutputName._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)pcVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"Depends","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&local_3d0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&gen);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Section","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x4ce180);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Priority","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x4d3033);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE","");
  pcVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"Architecture","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&local_418);
  pcVar3 = (char *)pmVar4->_M_string_length;
  strlen(pcVar6);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,pcVar3,(ulong)pcVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER","");
  pcVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"Maintainer","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&local_418);
  pcVar3 = (char *)pmVar4->_M_string_length;
  strlen(pcVar6);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,pcVar3,(ulong)pcVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"debug symbols for ","");
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_418,(ulong)packageNameLower._M_dataplus._M_p);
  pcVar8 = (cmCPackLog *)(plVar5 + 2);
  if ((cmCPackLog *)*plVar5 == pcVar8) {
    gen.OutputName._M_string_length._0_1_ = pcVar8->Verbose;
    gen.OutputName._M_string_length._1_1_ = pcVar8->Debug;
    gen.OutputName._M_string_length._2_1_ = pcVar8->Quiet;
    gen.OutputName._M_string_length._3_1_ = pcVar8->NewLine;
    gen.OutputName._M_string_length._4_4_ = pcVar8->LastTag;
    gen.OutputName.field_2._M_allocated_capacity._0_4_ = (undefined4)plVar5[3];
    gen.OutputName.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    gen.Logger = (cmCPackLog *)psVar1;
  }
  else {
    gen.OutputName._M_string_length._0_1_ = pcVar8->Verbose;
    gen.OutputName._M_string_length._1_1_ = pcVar8->Debug;
    gen.OutputName._M_string_length._2_1_ = pcVar8->Quiet;
    gen.OutputName._M_string_length._3_1_ = pcVar8->NewLine;
    gen.OutputName._M_string_length._4_4_ = pcVar8->LastTag;
    gen.Logger = (cmCPackLog *)*plVar5;
  }
  gen.OutputName._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)pcVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"Description","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&local_3f0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&gen);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SOURCE","");
  pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Source","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    pcVar6 = (char *)pmVar4->_M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)pmVar4,0,pcVar6,(ulong)pcVar3);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"GEN_BUILD_IDS","");
  pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Build-Ids","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    pcVar6 = (char *)pmVar4->_M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)pmVar4,0,pcVar6,(ulong)pcVar3);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  pcVar8 = (this->super_cmCPackGenerator).Logger;
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_418,"GEN_CPACK_DBGSYM_OUTPUT_FILE_NAME","");
  pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_418);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar3,&local_3f1);
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"GEN_DBGSYMDIR","");
  pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar3,&local_3f2);
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_390,"CPACK_TOPLEVEL_DIRECTORY","");
  pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_390);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar3,&local_3f3);
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3b0,"CPACK_TEMPORARY_DIRECTORY","");
  pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_3b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,pcVar3,&local_3f4);
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3d0,"GEN_CPACK_DEBIAN_COMPRESSION_TYPE","");
  pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_3d0);
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,"GEN_CPACK_DEBIAN_ARCHIVE_TYPE","");
  pcVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_2e0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_60,&controlValues._M_t);
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"");
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"");
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_340,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION","");
  bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_340);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78,&this->packageFiles);
  anon_unknown.dwarf_1a6f67::DebGenerator::DebGenerator
            (&gen,pcVar8,&local_98,&local_b8,&local_d8,&local_f8,pcVar3,pcVar6,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_60,false,&local_300,false,&local_320,false,&local_118,(char *)0x0,bVar2,
             &local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  bVar2 = anon_unknown.dwarf_1a6f67::DebGenerator::generate(&gen);
  anon_unknown.dwarf_1a6f67::DebGenerator::~DebGenerator(&gen);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)packageNameLower._M_dataplus._M_p != &packageNameLower.field_2) {
    operator_delete(packageNameLower._M_dataplus._M_p,
                    packageNameLower.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&controlValues._M_t);
  return (uint)bVar2;
}

Assistant:

int cmCPackDebGenerator::createDbgsymDDeb()
{
  // Packages containing debug symbols follow the same structure as .debs
  // but have different metadata and content.

  std::map<std::string, std::string> controlValues;
  // debian policy enforce lower case for package name
  std::string packageNameLower = cmsys::SystemTools::LowerCase(
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME"));
  const char* debian_pkg_version =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_VERSION");

  controlValues["Package"] = packageNameLower + "-dbgsym";
  controlValues["Package-Type"] = "ddeb";
  controlValues["Version"] = debian_pkg_version;
  controlValues["Auto-Built-Package"] = "debug-symbols";
  controlValues["Depends"] = this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME") +
    std::string(" (= ") + debian_pkg_version + ")";
  controlValues["Section"] = "debug";
  controlValues["Priority"] = "optional";
  controlValues["Architecture"] =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE");
  controlValues["Maintainer"] =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER");
  controlValues["Description"] =
    std::string("debug symbols for ") + packageNameLower;

  const char* debian_pkg_source =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SOURCE");
  if (debian_pkg_source && *debian_pkg_source) {
    controlValues["Source"] = debian_pkg_source;
  }
  const char* debian_build_ids = this->GetOption("GEN_BUILD_IDS");
  if (debian_build_ids && *debian_build_ids) {
    controlValues["Build-Ids"] = debian_build_ids;
  }

  DebGenerator gen(
    Logger, this->GetOption("GEN_CPACK_DBGSYM_OUTPUT_FILE_NAME"),
    this->GetOption("GEN_DBGSYMDIR"),

    this->GetOption("CPACK_TOPLEVEL_DIRECTORY"),
    this->GetOption("CPACK_TEMPORARY_DIRECTORY"),
    this->GetOption("GEN_CPACK_DEBIAN_COMPRESSION_TYPE"),
    this->GetOption("GEN_CPACK_DEBIAN_ARCHIVE_TYPE"), controlValues, false, "",
    false, "", false, "", nullptr,
    this->IsSet("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION"),
    packageFiles);

  if (!gen.generate()) {
    return 0;
  }
  return 1;
}